

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

bool tinyusdz::value::IsRoleType(uint32_t tyid)

{
  uint32_t uVar1;
  uint32_t in_EDX;
  string local_30;
  
  GetTypeName_abi_cxx11_(&local_30,(value *)(ulong)tyid,in_EDX);
  uVar1 = GetUnderlyingTypeId(&local_30);
  ::std::__cxx11::string::_M_dispose();
  return uVar1 != 0;
}

Assistant:

bool IsRoleType(const uint32_t tyid) {
  return GetUnderlyingTypeId(GetTypeName(tyid)) != value::TYPE_ID_INVALID;
}